

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_GetAddressByHash_Test::TestBody
          (ElementsAddressFactory_GetAddressByHash_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *lhs;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  ElementsAddressFactory factory;
  undefined6 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7e;
  undefined1 in_stack_fffffffffffffb7f;
  Address *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  NetType in_stack_fffffffffffffb8c;
  ElementsAddressFactory *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  AssertHelper local_450;
  Message local_448 [4];
  ByteData *in_stack_fffffffffffffbd8;
  AddressType in_stack_fffffffffffffbe4;
  AddressFactory *in_stack_fffffffffffffbe8;
  ConstCharPtr local_298;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_280;
  AddressType local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  ByteData local_258;
  string local_240;
  AssertionResult local_220;
  allocator local_209;
  string local_208;
  ByteData local_1e8;
  Address local_1d0;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffffb80);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffffb90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"c4d571179a455b8976b79cf99183fd2bbafe6bfd",&local_209);
  cfd::core::ByteData::ByteData(&local_1e8,&local_208);
  cfd::AddressFactory::GetAddressByHash
            (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8);
  cfd::core::ByteData::~ByteData((ByteData *)0x1f42dc);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::Address::GetHash
            ((Address *)
             CONCAT17(in_stack_fffffffffffffb7f,
                      CONCAT16(in_stack_fffffffffffffb7e,in_stack_fffffffffffffb78)));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_240,&local_258);
  lhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_220,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",lhs,
             "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  std::__cxx11::string::~string((string *)&local_240);
  cfd::core::ByteData::~ByteData((ByteData *)0x1f4372);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_260);
    in_stack_fffffffffffffb90 =
         (ElementsAddressFactory *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1f44c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x8b,(char *)in_stack_fffffffffffffb90);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message((Message *)0x1f451d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f4575);
  local_27c = cfd::core::Address::GetAddressType(&local_1d0);
  local_280 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((char *)CONCAT17(uVar1,in_stack_fffffffffffffb98),(char *)in_stack_fffffffffffffb90,
             (AddressType *)CONCAT44(local_27c,in_stack_fffffffffffffb88),
             (AddressType *)in_stack_fffffffffffffb80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar2) {
    testing::Message::Message(&local_288);
    in_stack_fffffffffffffb80 =
         (Address *)testing::AssertionResult::failure_message((AssertionResult *)0x1f4634);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x8c,(char *)in_stack_fffffffffffffb80);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x1f4691);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f46e9);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_298,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_298);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ByteData::ByteData((ByteData *)(local_448 + 3));
      cfd::AddressFactory::GetAddressByHash
                (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8);
      cfd::core::Address::~Address(in_stack_fffffffffffffb80);
      cfd::core::ByteData::~ByteData((ByteData *)0x1f477d);
    }
    local_298.value =
         "Expected: factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_448);
  testing::internal::AssertHelper::AssertHelper
            (&local_450,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x8e,local_298.value);
  testing::internal::AssertHelper::operator=(&local_450,local_448);
  testing::internal::AssertHelper::~AssertHelper(&local_450);
  testing::Message::~Message((Message *)0x1f48a2);
  cfd::core::Address::~Address(in_stack_fffffffffffffb80);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f48fe);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetAddressByHash)
{
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);

    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData()), CfdException);
  }
}